

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

vector<CAddress,_std::allocator<CAddress>_> * __thiscall
CConnman::GetAddresses(CConnman *this,CNode *requestor,size_t max_addresses,size_t max_pct)

{
  Span<const_unsigned_char> data;
  optional<Network> network;
  undefined1 uVar1;
  strong_ordering sVar2;
  bool bVar3;
  CSipHasher *max_addresses_00;
  uint64_t max_pct_00;
  vector<CAddress,_std::allocator<CAddress>_> *__x;
  pointer ppVar4;
  type range;
  type tVar5;
  long in_RSI;
  vector<CAddress,_std::allocator<CAddress>_> *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_CConnman::CachedAddrResponse>_>,_bool>
  pVar6;
  CachedAddrResponse *cache_entry;
  duration<long,_std::ratio<1L,_1000000L>_> current_time;
  uint64_t cache_id;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_socket_bytes;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_CConnman::CachedAddrResponse>_>,_bool>
  r;
  CNode *in_stack_fffffffffffffd68;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffffd70;
  hours in_stack_fffffffffffffd78;
  duration<long,_std::ratio<3600L,_1L>_> *in_stack_fffffffffffffd80;
  CConnman *in_stack_fffffffffffffd88;
  duration<long,_std::ratio<1L,_1000000L>_> *__lhs;
  uint64_t in_stack_fffffffffffffd90;
  CSipHasher *in_stack_fffffffffffffd98;
  undefined6 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdae;
  undefined1 in_stack_fffffffffffffdaf;
  undefined8 in_stack_fffffffffffffdc0;
  vector<CAddress,_std::allocator<CAddress>_> *this_00;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  undefined1 filtered;
  uint uVar7;
  uint16_t in_stack_fffffffffffffde4;
  undefined1 in_stack_fffffffffffffde6;
  undefined7 in_stack_fffffffffffffe18;
  duration<long,_std::ratio<1L,_1000000L>_> local_170 [4];
  _Base_ptr local_150;
  undefined1 local_148;
  undefined4 local_13c;
  vector<CAddress,_std::allocator<CAddress>_> local_138;
  rep local_110;
  uint64_t local_f8;
  optional<Network> local_d8;
  _Base_ptr local_d0;
  undefined1 local_c8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::GetAddrBytes((CNetAddr *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
  GetDeterministicRandomizer(in_stack_fffffffffffffd88,(uint64_t)in_stack_fffffffffffffd80);
  CNode::ConnectedThroughNetwork((CNode *)in_stack_fffffffffffffd78.__r);
  CSipHasher::Write(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((Span<const_unsigned_char> *)in_stack_fffffffffffffd78.__r,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd68);
  data.m_size._0_7_ = in_stack_fffffffffffffdc8;
  data.m_data = (uchar *)in_stack_fffffffffffffdc0;
  data.m_size._7_1_ = in_stack_fffffffffffffdcf;
  CSipHasher::Write((CSipHasher *)
                    CONCAT17(in_stack_fffffffffffffdaf,
                             CONCAT16(in_stack_fffffffffffffdae,in_stack_fffffffffffffda8)),data);
  uVar1 = CNode::IsInboundConn(in_stack_fffffffffffffd68);
  if ((bool)uVar1) {
    in_stack_fffffffffffffde4 = CService::GetPort((CService *)in_stack_fffffffffffffd68);
    uVar7 = (uint)in_stack_fffffffffffffde4;
  }
  else {
    uVar7 = 0;
  }
  max_addresses_00 = CSipHasher::Write(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  max_pct_00 = CSipHasher::Finalize(in_stack_fffffffffffffd98);
  local_f8 = max_pct_00;
  local_110 = (rep)GetTime<std::chrono::duration<long,std::ratio<1l,1000000l>>>();
  filtered = (undefined1)((ulong)local_110 >> 0x38);
  __x = (vector<CAddress,_std::allocator<CAddress>_> *)(in_RSI + 0x1f8);
  this_00 = &local_138;
  local_138.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_138.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_138.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffffd68);
  local_13c = 0;
  std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>
            ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffffd68,(int *)0x101138a
            );
  pVar6 = std::
          map<unsigned_long,CConnman::CachedAddrResponse,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,CConnman::CachedAddrResponse>>>
          ::emplace<unsigned_long&,CConnman::CachedAddrResponse>
                    ((map<unsigned_long,_CConnman::CachedAddrResponse,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CConnman::CachedAddrResponse>_>_>
                      *)in_stack_fffffffffffffd88,(unsigned_long *)in_stack_fffffffffffffd80,
                     (CachedAddrResponse *)in_stack_fffffffffffffd78.__r);
  local_150 = (_Base_ptr)pVar6.first._M_node;
  local_148 = pVar6.second;
  local_d0 = local_150;
  local_c8 = local_148;
  CachedAddrResponse::~CachedAddrResponse((CachedAddrResponse *)in_stack_fffffffffffffd68);
  ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_CConnman::CachedAddrResponse>_>::
           operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_CConnman::CachedAddrResponse>_>
                       *)in_stack_fffffffffffffd68);
  sVar2 = _GLOBAL__N_1::std::chrono::
          operator<=><long,_std::ratio<1L,_1000000L>,_long,_std::ratio<1L,_1000000L>_>
                    ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffffd80,
                     (duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffffd78.__r);
  std::__cmp_cat::__unspec::__unspec((__unspec *)in_stack_fffffffffffffd68,(__unspec *)0x1011448);
  bVar3 = std::operator<(sVar2._M_value);
  if (bVar3) {
    std::optional<Network>::optional(&local_d8);
    network.super__Optional_base<Network,_true,_true>._M_payload.
    super__Optional_payload_base<Network>._7_1_ = sVar2._M_value;
    network.super__Optional_base<Network,_true,_true>._M_payload.
    super__Optional_payload_base<Network>._M_payload =
         (_Storage<Network,_true>)(int)in_stack_fffffffffffffe18;
    network.super__Optional_base<Network,_true,_true>._M_payload.
    super__Optional_payload_base<Network>._M_engaged =
         (bool)(char)((uint7)in_stack_fffffffffffffe18 >> 0x20);
    network.super__Optional_base<Network,_true,_true>._M_payload.
    super__Optional_payload_base<Network>._5_2_ = (short)((uint7)in_stack_fffffffffffffe18 >> 0x28);
    GetAddresses((CConnman *)
                 CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffde6,
                                         CONCAT24(in_stack_fffffffffffffde4,uVar7))),
                 (size_t)max_addresses_00,max_pct_00,network,(bool)filtered);
    __lhs = local_170;
    std::vector<CAddress,_std::allocator<CAddress>_>::operator=
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffffd78.__r,
               (vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffffd70);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffffd78.__r);
    h<(char)50,(char)49>();
    range = std::chrono::operator+(__lhs,in_stack_fffffffffffffd80);
    FastRandomContext::FastRandomContext
              ((FastRandomContext *)in_stack_fffffffffffffd78.__r,
               SUB81((ulong)in_stack_fffffffffffffd70 >> 0x38,0));
    in_stack_fffffffffffffd78 = h<(char)54>();
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<long,std::ratio<3600l,1l>,void>
              ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffffd70,
               (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_fffffffffffffd68);
    RandomMixin<FastRandomContext>::
    randrange<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
              (in_stack_fffffffffffffd70,
               (common_type_t<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>)range.__r);
    tVar5 = std::chrono::operator+
                      (in_stack_fffffffffffffd78.__r,
                       (duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffffd70);
    (ppVar4->second).m_cache_entry_expiration.__r = tVar5.__r;
    FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_fffffffffffffd68);
  }
  std::vector<CAddress,_std::allocator<CAddress>_>::vector(this_00,__x);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd78.__r)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::vector<CAddress> CConnman::GetAddresses(CNode& requestor, size_t max_addresses, size_t max_pct)
{
    auto local_socket_bytes = requestor.addrBind.GetAddrBytes();
    uint64_t cache_id = GetDeterministicRandomizer(RANDOMIZER_ID_ADDRCACHE)
        .Write(requestor.ConnectedThroughNetwork())
        .Write(local_socket_bytes)
        // For outbound connections, the port of the bound address is randomly
        // assigned by the OS and would therefore not be useful for seeding.
        .Write(requestor.IsInboundConn() ? requestor.addrBind.GetPort() : 0)
        .Finalize();
    const auto current_time = GetTime<std::chrono::microseconds>();
    auto r = m_addr_response_caches.emplace(cache_id, CachedAddrResponse{});
    CachedAddrResponse& cache_entry = r.first->second;
    if (cache_entry.m_cache_entry_expiration < current_time) { // If emplace() added new one it has expiration 0.
        cache_entry.m_addrs_response_cache = GetAddresses(max_addresses, max_pct, /*network=*/std::nullopt);
        // Choosing a proper cache lifetime is a trade-off between the privacy leak minimization
        // and the usefulness of ADDR responses to honest users.
        //
        // Longer cache lifetime makes it more difficult for an attacker to scrape
        // enough AddrMan data to maliciously infer something useful.
        // By the time an attacker scraped enough AddrMan records, most of
        // the records should be old enough to not leak topology info by
        // e.g. analyzing real-time changes in timestamps.
        //
        // It takes only several hundred requests to scrape everything from an AddrMan containing 100,000 nodes,
        // so ~24 hours of cache lifetime indeed makes the data less inferable by the time
        // most of it could be scraped (considering that timestamps are updated via
        // ADDR self-announcements and when nodes communicate).
        // We also should be robust to those attacks which may not require scraping *full* victim's AddrMan
        // (because even several timestamps of the same handful of nodes may leak privacy).
        //
        // On the other hand, longer cache lifetime makes ADDR responses
        // outdated and less useful for an honest requestor, e.g. if most nodes
        // in the ADDR response are no longer active.
        //
        // However, the churn in the network is known to be rather low. Since we consider
        // nodes to be "terrible" (see IsTerrible()) if the timestamps are older than 30 days,
        // max. 24 hours of "penalty" due to cache shouldn't make any meaningful difference
        // in terms of the freshness of the response.
        cache_entry.m_cache_entry_expiration = current_time +
            21h + FastRandomContext().randrange<std::chrono::microseconds>(6h);
    }
    return cache_entry.m_addrs_response_cache;
}